

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O2

Value __thiscall toml::internal::Parser::parse(Parser *this)

{
  TokenType TVar1;
  bool bVar2;
  Value *current;
  anon_union_8_8_51f126cb_for_Value_2 extraout_RDX;
  Parser *in_RSI;
  Value VVar3;
  Value root;
  allocator local_69;
  undefined1 local_68 [32];
  _Base_ptr local_48;
  size_t local_40;
  Value local_30;
  
  local_68._24_8_ = local_68 + 8;
  local_68._0_8_ = (pointer)0x0;
  local_68._8_8_ = 0;
  local_68._16_8_ = (_Base_ptr)0x0;
  local_40 = 0;
  local_48 = (_Base_ptr)local_68._24_8_;
  Value::Value(&local_30,(Table *)local_68);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
               *)local_68);
  current = &local_30;
  do {
    while( true ) {
      skipForKey(in_RSI);
      TVar1 = (in_RSI->token_).type_;
      if (TVar1 == END_OF_FILE) {
        Value::Value((Value *)this,&local_30);
        goto LAB_0012df75;
      }
      if (TVar1 != LBRACKET) break;
      current = parseGroupKey(in_RSI,&local_30);
      if (current == (Value *)0x0) {
        std::__cxx11::string::string((string *)local_68,"error when parsing group key",&local_69);
        addError(in_RSI,(string *)local_68);
LAB_0012df63:
        std::__cxx11::string::~string((string *)local_68);
        *(undefined4 *)&(this->lexer_).is_ = 0;
        *(undefined8 *)&(this->lexer_).lineNo_ = 0;
LAB_0012df75:
        Value::~Value(&local_30);
        VVar3.field_1.null_ = extraout_RDX.null_;
        VVar3._0_8_ = this;
        return VVar3;
      }
    }
    bVar2 = parseKeyValue(in_RSI,current);
  } while (bVar2);
  std::__cxx11::string::string((string *)local_68,"error when parsing key Value",&local_69);
  addError(in_RSI,(string *)local_68);
  goto LAB_0012df63;
}

Assistant:

inline Value Parser::parse()
{
    Value root((Table()));
    Value* currentValue = &root;

    while (true) {
        skipForKey();
        if (token().type() == TokenType::END_OF_FILE)
            break;
        if (token().type() == TokenType::LBRACKET) {
            currentValue = parseGroupKey(&root);
            if (!currentValue) {
                addError("error when parsing group key");
                return Value();
            }
            continue;
        }

        if (!parseKeyValue(currentValue)) {
            addError("error when parsing key Value");
            return Value();
        }
    }
    return root;
}